

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O2

int use_rtc_reference_structure_one_layer(AV1_COMP *cpi)

{
  AV1_PRIMARY *pAVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = is_one_pass_rt_params(cpi);
  uVar3 = 0;
  if (((iVar2 != 0) && (pAVar1 = cpi->ppi, pAVar1->number_spatial_layers == 1)) &&
     (uVar3 = 0, pAVar1->number_temporal_layers == 1)) {
    uVar3 = (uint)((pAVar1->rtc_ref).set_ref_frame_config == 0);
  }
  return uVar3;
}

Assistant:

static inline int use_rtc_reference_structure_one_layer(const AV1_COMP *cpi) {
  return is_one_pass_rt_params(cpi) && cpi->ppi->number_spatial_layers == 1 &&
         cpi->ppi->number_temporal_layers == 1 &&
         !cpi->ppi->rtc_ref.set_ref_frame_config;
}